

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

int __thiscall SSD1306::OledI2C::init(OledI2C *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint8_t in_stack_0000008d;
  uint8_t in_stack_0000008e;
  uint8_t in_stack_0000008f;
  OledI2C *in_stack_00000090;
  
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e,in_stack_0000008d);
  sendCommand(in_stack_00000090,in_stack_0000008f,in_stack_0000008e);
  sendCommand(in_stack_00000090,in_stack_0000008f);
  iVar1 = usleep(100000);
  return iVar1;
}

Assistant:

void
SSD1306::OledI2C::init() const
{
    // Enable charge pump regulator - 8Dh, 14h

    sendCommand(OLED_ENABLE_CHARGE_PUMP_REGULATOR, 0x14);

    // Set Memory Addressing Mode - 20h, 00h

    sendCommand(OLED_SET_MEMORY_ADDRESSING_MODE, OLED_PAGE_ADDRESSING_MODE);

    // Set Osc Frequency D5h, 80h

    sendCommand(OLED_SET_OSC_FREQUENCY, 0x80);

    // Set Display Offset - D3h, 00h

    sendCommand(OLED_SET_DISPLAY_OFFSET, 0x00);

    // Set Display Start Line - 40h

    sendCommand(OLED_SET_DISPLAY_START_LINE_MASK | 0x00);

    // Set Segment re-map - A0h/A1h

    sendCommand(OLED_SET_SEGMENT_REMAP_127);

    // Set COM Output Scan Direction - C0, C8h

    sendCommand(OLED_SET_COM_OUTPUT_SCAN_DIRECTION_REMAP);

    // Set COM Pins hardware configuration - DAh, 12h

    sendCommand(OLED_SET_COM_PINS_HARDWARE_CONFIGURATION, 0x12);

    // Set Pre-charge Period D9h, F1h

    sendCommand(OLED_SET_PRECHARGE_PERIOD, 0xF1);

    // Set Vcomh Deselect Level - DBh, 40h

    sendCommand(OLED_SET_VCOMH_DESELECT_LEVEL, 0x40);

    // Disable Entire Display On - A4h

    sendCommand(OLED_SET_ENTIRE_DISPLAY_ON_RESUME);

    // Set Normal Display - A6h

    sendCommand(OLED_SET_NORMAL_DISPLAY);

    // Set Column Address - 21h, 00h, 7Fh

    sendCommand(OLED_SET_COLUMN_ADDRESS, 0x00, 0x7F);

    // Set Page Address - 22h, 00h, 07h

    sendCommand(OLED_SET_PAGE_ADDRESS, 0x00, 0x07);

    // Set Contrast Control - 81h, 7Fh

    sendCommand(OLED_SET_CONTRAST, 0x7F);

    // Display On - AFh

    sendCommand(OLED_SET_DISPLAY_ON);

    usleep(100000);
}